

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

QApplication * __thiscall QApplication::font(QApplication *this,char *className)

{
  Span *pSVar1;
  Type *this_00;
  ulong uVar2;
  long in_FS_OFFSET;
  const_iterator cVar3;
  QByteArray local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                        *)this);
  if (((this_00 != (Type *)0x0 && className != (char *)0x0) && (this_00->d != (Data *)0x0)) &&
     (this_00->d->size != 0)) {
    QByteArray::QByteArray(&local_40,className,-1);
    cVar3 = QHash<QByteArray,_QFont>::constFindImpl<QByteArray>(this_00,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (cVar3.i.d != (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)0x0 || cVar3.i.bucket != 0) {
      pSVar1 = (cVar3.i.d)->spans;
      uVar2 = cVar3.i.bucket >> 7;
      QFont::QFont((QFont *)this,
                   (QFont *)(pSVar1[uVar2].entries
                             [pSVar1[uVar2].offsets[(uint)cVar3.i.bucket & 0x7f]].storage.data +
                            0x18));
      goto LAB_002bb3ae;
    }
  }
  QGuiApplication::font();
LAB_002bb3ae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFont QApplication::font(const char *className)
{
    FontHash *hash = app_fonts();
    if (className && hash && hash->size()) {
        QHash<QByteArray, QFont>::ConstIterator it = hash->constFind(className);
        if (it != hash->constEnd())
            return *it;
    }
    return font();
}